

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzgeoelrefless.h.h
# Opt level: O0

TPZGeoEl * __thiscall
TPZGeoElRefLess<pzgeom::TPZQuadraticCube>::CreateBCGeoBlendEl
          (TPZGeoElRefLess<pzgeom::TPZQuadraticCube> *this,int side,int bc)

{
  undefined8 uVar1;
  int iVar2;
  undefined4 uVar3;
  long lVar4;
  long *plVar5;
  undefined4 extraout_var;
  uint in_EDX;
  int in_ESI;
  TPZGeoEl *in_RDI;
  TPZGeoElSide newelside;
  TPZGeoElSide me;
  TPZGeoEl *newel;
  MElementType BCtype;
  TPZGeoMesh *mesh;
  int64_t index;
  int inode;
  TPZManVector<long,_10> nodeindices;
  int sidennodes;
  undefined8 in_stack_fffffffffffffed0;
  int side_00;
  TPZManVector<long,_10> *this_00;
  TPZGeoEl *in_stack_fffffffffffffed8;
  TPZGeoEl *gel;
  undefined4 in_stack_fffffffffffffee0;
  undefined4 in_stack_fffffffffffffee4;
  int64_t in_stack_fffffffffffffee8;
  undefined4 in_stack_fffffffffffffef0;
  undefined4 in_stack_fffffffffffffef4;
  undefined1 local_f0 [184];
  TPZGeoElSide *in_stack_ffffffffffffffc8;
  TPZGeoElSide *in_stack_ffffffffffffffd0;
  
  iVar2 = pztopology::TPZCube::NSideNodes(in_ESI);
  TPZManVector<long,_10>::TPZManVector
            ((TPZManVector<long,_10> *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0)
             ,in_stack_fffffffffffffee8);
  for (local_f0._100_4_ = 0; side_00 = (int)((ulong)in_stack_fffffffffffffed0 >> 0x20),
      (int)local_f0._100_4_ < iVar2; local_f0._100_4_ = local_f0._100_4_ + 1) {
    lVar4 = (**(code **)(*(long *)in_RDI + 0x128))(in_RDI,in_ESI,local_f0._100_4_);
    plVar5 = TPZVec<long>::operator[]((TPZVec<long> *)(local_f0 + 0x68),(long)(int)local_f0._100_4_)
    ;
    *plVar5 = lVar4;
  }
  local_f0._64_8_ = TPZGeoEl::Mesh(in_RDI);
  local_f0._60_4_ = pztopology::TPZCube::Type(in_ESI);
  iVar2 = (*((TPZSavable *)local_f0._64_8_)->_vptr_TPZSavable[0xd])
                    (local_f0._64_8_,(ulong)(uint)local_f0._60_4_,local_f0 + 0x68,(ulong)in_EDX,
                     local_f0 + 0x48);
  local_f0._48_8_ = CONCAT44(extraout_var,iVar2);
  TPZGeoElSide::TPZGeoElSide
            ((TPZGeoElSide *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
             in_stack_fffffffffffffed8,side_00);
  gel = (TPZGeoEl *)local_f0._48_8_;
  uVar3 = (**(code **)(*(long *)local_f0._48_8_ + 0xf0))();
  this_00 = (TPZManVector<long,_10> *)local_f0;
  TPZGeoElSide::TPZGeoElSide
            ((TPZGeoElSide *)CONCAT44(uVar3,in_stack_fffffffffffffee0),gel,
             (int)((ulong)this_00 >> 0x20));
  TPZGeoElSide::InsertConnectivity(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  (**(code **)(*(long *)local_f0._48_8_ + 0x78))();
  uVar1 = local_f0._48_8_;
  TPZGeoElSide::~TPZGeoElSide((TPZGeoElSide *)0x1758637);
  TPZGeoElSide::~TPZGeoElSide((TPZGeoElSide *)0x1758641);
  TPZManVector<long,_10>::~TPZManVector(this_00);
  return (TPZGeoEl *)uVar1;
}

Assistant:

TPZGeoEl *TPZGeoElRefLess<TGeo>::CreateBCGeoBlendEl(int side,int bc)
{
	int sidennodes = TGeo::NSideNodes(side);
	TPZManVector<int64_t> nodeindices(sidennodes);
	int inode;
	for(inode=0; inode<sidennodes; inode++){
		nodeindices[inode] = this->SideNodeIndex(side,inode);
	}
	int64_t index;
	
	TPZGeoMesh *mesh = this->Mesh();
	MElementType BCtype = TGeo::Type(side);
	
	TPZGeoEl *newel = mesh->CreateGeoBlendElement(BCtype, nodeindices, bc, index);
	TPZGeoElSide me(this,side);
	TPZGeoElSide newelside(newel,newel->NSides()-1);
	
	newelside.InsertConnectivity(me);
	newel->Initialize();
	
	return newel;
}